

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::dctsub(int n,double *a,int nc,double *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  double xr;
  double wki;
  double wkr;
  int m;
  int ks;
  int kk;
  int k;
  int j;
  double *c_local;
  int nc_local;
  double *a_local;
  int n_local;
  
  iVar7 = n >> 1;
  kk = 0;
  for (j = 1; j < iVar7; j = j + 1) {
    iVar8 = n - j;
    kk = nc / n + kk;
    dVar1 = c[kk];
    dVar2 = c[nc - kk];
    dVar3 = c[kk];
    dVar4 = c[nc - kk];
    dVar5 = a[j];
    dVar6 = a[iVar8];
    a[j] = (dVar1 - dVar2) * a[j] + (dVar3 + dVar4) * a[iVar8];
    a[iVar8] = (dVar3 + dVar4) * dVar5 + -((dVar1 - dVar2) * dVar6);
  }
  a[iVar7] = *c * a[iVar7];
  return;
}

Assistant:

void dctsub(int n, double *a, int nc, double *c) {
  int j, k, kk, ks, m;
  double wkr, wki, xr;

  m = n >> 1;
  ks = nc / n;
  kk = 0;
  for (j = 1; j < m; j++) {
    k = n - j;
    kk += ks;
    wkr = c[kk] - c[nc - kk];
    wki = c[kk] + c[nc - kk];
    xr = wki * a[j] - wkr * a[k];
    a[j] = wkr * a[j] + wki * a[k];
    a[k] = xr;
  }
  a[m] *= c[0];
}